

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

vec3 __thiscall vera::Triangle::getClosestPoint(Triangle *this,vec3 *_p)

{
  vec<3,_float,_(glm::qualifier)0> *v1;
  vec<3,_float,_(glm::qualifier)0> *v2;
  vec<3,_float,_(glm::qualifier)0> *v1_00;
  vec<3,_float,_(glm::qualifier)0> *v2_00;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar5;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar6;
  vec<3,_float,_(glm::qualifier)0> vVar7;
  vec3 vVar8;
  vec<3,_float,_(glm::qualifier)0> vVar9;
  vec<3,_float,_(glm::qualifier)0> vVar10;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  undefined1 local_98 [8];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_90;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_8c;
  undefined1 local_88 [24];
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  
  v2_00 = this->m_vertices;
  v1_00 = this->m_vertices + 1;
  vVar7 = glm::operator-(v1_00,v2_00);
  local_70.field_2 = vVar7.field_2;
  local_70._0_8_ = vVar7._0_8_;
  v1 = this->m_vertices + 2;
  vVar7 = glm::operator-(v1,v2_00);
  local_40.field_2 = vVar7.field_2;
  local_40._0_8_ = vVar7._0_8_;
  vVar7 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_40,&local_70);
  local_b8.field_2 = vVar7.field_2;
  local_b8._0_8_ = vVar7._0_8_;
  vVar7 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_b8);
  local_50.field_2 = vVar7.field_2;
  local_50._0_8_ = vVar7._0_8_;
  vVar7 = glm::operator-(_p,v2_00);
  local_c8.field_2 = vVar7.field_2;
  local_c8._0_8_ = vVar7._0_8_;
  fVar1 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                    (&local_50,&local_c8);
  local_60.field_2.z = fVar1 * local_50.field_2.z;
  local_60.field_1.y = fVar1 * local_50.field_1.y;
  local_60.field_0.x = fVar1 * local_50.field_0.x;
  vVar7 = glm::operator-(_p,&local_60);
  local_b8.field_2 = vVar7.field_2;
  local_b8._0_8_ = vVar7._0_8_;
  vVar7 = glm::operator-(&local_b8,v2_00);
  local_60.field_2 = vVar7.field_2;
  local_60._0_8_ = vVar7._0_8_;
  vVar8 = getBarycentric(&local_70,&local_40,&local_60);
  local_98._4_4_ = vVar8.field_1;
  if (0.0 <= vVar8.field_0.x) {
    if (0.0 <= (float)local_98._4_4_) {
      if (0.0 <= vVar8.field_2.z) {
        local_98._0_4_ = local_98._4_4_;
        aStack_90 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_98._4_4_;
        aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_98._4_4_;
        vVar7 = glm::operator*(v2_00,vVar8.field_0.x);
        local_88._8_4_ = extraout_XMM0_Dc;
        local_88._0_8_ = vVar7._0_8_;
        local_88._12_4_ = extraout_XMM0_Dd;
        vVar9 = glm::operator*(v1_00,(float)local_98._0_4_);
        aStack_90 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                    extraout_XMM0_Dc_00;
        local_98 = (undefined1  [8])vVar9._0_8_;
        aStack_8c = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
                    extraout_XMM0_Dd_00;
        vVar10 = glm::operator*(v1,vVar8.field_2.z);
        aVar5.x = (float)local_98._0_4_ + (float)local_88._0_4_ + vVar10.field_0.x;
        aVar6.y = (float)local_98._4_4_ + (float)local_88._4_4_ + vVar10.field_1.y;
        aVar4.z = vVar10.field_2.z + vVar9.field_2.z + vVar7.field_2.z;
        goto LAB_00252066;
      }
      fVar2 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_70);
      vVar7 = glm::operator-(&local_b8,v2_00);
      local_c8.field_2 = vVar7.field_2;
      local_c8._0_8_ = vVar7._0_8_;
      fVar3 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                        (&local_70,&local_c8);
      fVar1 = fVar2;
      if (fVar3 / fVar2 <= fVar2) {
        fVar1 = fVar3 / fVar2;
      }
      if (fVar1 <= 0.0) {
        fVar1 = 0.0;
      }
      fVar1 = fVar1 / fVar2;
      local_c8.field_2.z = fVar1 * local_70.field_2.z;
      local_c8.field_1.y = fVar1 * local_70.field_1.y;
      local_c8.field_0.x = fVar1 * local_70.field_0.x;
      v2 = &local_c8;
    }
    else {
      vVar7 = glm::operator-(v2_00,v1);
      local_c8.field_2 = vVar7.field_2;
      local_c8._0_8_ = vVar7._0_8_;
      fVar2 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_c8);
      vVar7 = glm::operator-(&local_b8,v1);
      local_a8.field_2 = vVar7.field_2;
      local_a8._0_8_ = vVar7._0_8_;
      fVar3 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                        (&local_c8,&local_a8);
      fVar1 = fVar2;
      if (fVar3 / fVar2 <= fVar2) {
        fVar1 = fVar3 / fVar2;
      }
      if (fVar1 <= 0.0) {
        fVar1 = 0.0;
      }
      fVar1 = fVar1 / fVar2;
      local_a8.field_2.z = fVar1 * local_c8.field_2.z;
      local_a8.field_1.y = fVar1 * local_c8.field_1.y;
      local_a8.field_0.x = fVar1 * local_c8.field_0.x;
      v2 = &local_a8;
      v2_00 = v1;
    }
  }
  else {
    vVar7 = glm::operator-(v1,v1_00);
    local_c8.field_2 = vVar7.field_2;
    local_c8._0_8_ = vVar7._0_8_;
    local_88._0_4_ =
         glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_c8);
    vVar7 = glm::operator-(&local_b8,v1_00);
    local_a8.field_2 = vVar7.field_2;
    local_a8._0_8_ = vVar7._0_8_;
    fVar2 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      (&local_c8,&local_a8);
    fVar1 = (float)local_88._0_4_;
    if (fVar2 / (float)local_88._0_4_ <= (float)local_88._0_4_) {
      fVar1 = fVar2 / (float)local_88._0_4_;
    }
    if (fVar1 <= 0.0) {
      fVar1 = 0.0;
    }
    fVar1 = fVar1 / (float)local_88._0_4_;
    local_a8.field_2.z = fVar1 * local_c8.field_2.z;
    local_a8.field_1.y = fVar1 * local_c8.field_1.y;
    local_a8.field_0.x = fVar1 * local_c8.field_0.x;
    v2 = &local_a8;
    v2_00 = v1_00;
  }
  vVar7 = glm::operator+(v2_00,v2);
  aVar4 = vVar7.field_2;
  aVar5 = vVar7.field_0;
  aVar6 = vVar7.field_1;
LAB_00252066:
  vVar8.field_1 = aVar6;
  vVar8.field_0 = aVar5;
  vVar8.field_2 = aVar4;
  return vVar8;
}

Assistant:

glm::vec3 Triangle::getClosestPoint(const glm::vec3& _p) const {
    // https://github.com/nmoehrle/libacc/blob/master/primitives.h#L71
    glm::vec3 ab = m_vertices[1] - m_vertices[0];
    glm::vec3 ac = m_vertices[2] - m_vertices[0];
    glm::vec3 normal = glm::normalize( glm::cross(ac,ab) );

    glm::vec3 p = _p - glm::dot(normal, _p - m_vertices[0]) * normal;
    glm::vec3 ap = p - m_vertices[0];

    glm::vec3 bcoords = getBarycentric(ab, ac, ap);

    if (bcoords[0] < 0.0f) {
        glm::vec3 bc = m_vertices[2] - m_vertices[1];
        float n = glm::length( bc ); // bc.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(bc, p - m_vertices[1]) / n, n));
        return m_vertices[1] + t / n * bc;
    }

    if (bcoords[1] < 0.0f) {
        glm::vec3 ca = m_vertices[0] - m_vertices[2];
        float n = glm::length( ca ); //ca.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(ca, p - m_vertices[2]) / n, n));
        return m_vertices[2] + t / n * ca;
    }

    if (bcoords[2] < 0.0f) {
        //glm::vec3 ab = m_vertices[1] - m_vertices[0];
        float n = glm::length( ab ); //ab.norm();
        
        float t = glm::max(0.0f, glm::min( glm::dot(ab, p - m_vertices[0]) / n, n));
        return m_vertices[0] + t / n * ab;
    }

    return (m_vertices[0] * bcoords[0] + m_vertices[1] * bcoords[1] + m_vertices[2] * bcoords[2]);
}